

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

void tbx_destroy(tbx_t *tbx)

{
  kh_s2i_t *h;
  uint local_1c;
  khint_t k;
  kh_s2i_t *d;
  tbx_t *tbx_local;
  
  h = (kh_s2i_t *)tbx->dict;
  if (h != (kh_s2i_t *)0x0) {
    for (local_1c = 0; local_1c != h->n_buckets; local_1c = local_1c + 1) {
      if ((h->flags[local_1c >> 4] >> (sbyte)((local_1c & 0xf) << 1) & 3) == 0) {
        free(h->keys[local_1c]);
      }
    }
  }
  hts_idx_destroy(tbx->idx);
  kh_destroy_s2i(h);
  free(tbx);
  return;
}

Assistant:

void tbx_destroy(tbx_t *tbx)
{
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;
    if (d != NULL)
    {
        khint_t k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
    }
    hts_idx_destroy(tbx->idx);
    kh_destroy(s2i, d);
    free(tbx);
}